

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.h
# Opt level: O1

void std::
     __move_median_to_first<__gnu_cxx::__normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t*,std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t,std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,unsigned__int128,float>>,Gudhi::ripser::TParams<false,unsigned__int128,float>>::diameter_simplex_t>>>
               (__normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>_>
                __result,
               __normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>_>
               __a,__normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>_>
                   __b,__normal_iterator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t_*,_std::vector<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t,_std::allocator<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>_>
                       __c,
               _Iter_comp_iter<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::Greater_diameter_or_smaller_index<Gudhi::ripser::Rips_filtration<Gudhi::ripser::Sparse_distance_matrix<Params>,_Gudhi::ripser::Cns_encoding<Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>,_Gudhi::ripser::TParams<false,_unsigned___int128,_float>_>::diameter_simplex_t>_>
               __comp)

{
  ulong *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  simplex_t sVar10;
  value_t vVar11;
  undefined4 uVar12;
  value_t vVar13;
  undefined4 uVar14;
  
  fVar2 = (__a._M_current)->diameter;
  fVar3 = (__b._M_current)->diameter;
  if ((fVar3 < fVar2) ||
     (((fVar2 == fVar3 && (!NAN(fVar2) && !NAN(fVar3))) &&
      (uVar5 = *(ulong *)((long)&(__a._M_current)->index + 8),
      puVar1 = (ulong *)((long)&(__b._M_current)->index + 8),
      uVar5 < *puVar1 ||
      uVar5 - *puVar1 < (ulong)((ulong)(__a._M_current)->index < (ulong)(__b._M_current)->index)))))
  {
    fVar4 = (__c._M_current)->diameter;
    if ((fVar3 <= fVar4) &&
       (((fVar3 != fVar4 || (NAN(fVar3) || NAN(fVar4))) ||
        (uVar5 = *(ulong *)((long)&(__b._M_current)->index + 8),
        puVar1 = (ulong *)((long)&(__c._M_current)->index + 8),
        *puVar1 <= uVar5 &&
        (ulong)((ulong)(__b._M_current)->index < (ulong)(__c._M_current)->index) <= uVar5 - *puVar1)
        ))) {
      if ((fVar4 < fVar2) ||
         (((fVar2 == fVar4 && (!NAN(fVar2) && !NAN(fVar4))) &&
          (uVar5 = *(ulong *)((long)&(__a._M_current)->index + 8),
          puVar1 = (ulong *)((long)&(__c._M_current)->index + 8),
          uVar5 < *puVar1 ||
          uVar5 - *puVar1 < (ulong)((ulong)(__a._M_current)->index < (ulong)(__c._M_current)->index)
          )))) goto LAB_0011c3a7;
      goto LAB_0011c3d8;
    }
  }
  else {
    fVar4 = (__c._M_current)->diameter;
    if ((fVar4 < fVar2) ||
       (((fVar2 == fVar4 && (!NAN(fVar2) && !NAN(fVar4))) &&
        (uVar5 = *(ulong *)((long)&(__a._M_current)->index + 8),
        puVar1 = (ulong *)((long)&(__c._M_current)->index + 8),
        uVar5 < *puVar1 ||
        uVar5 - *puVar1 < (ulong)((ulong)(__a._M_current)->index < (ulong)(__c._M_current)->index)))
       )) {
LAB_0011c3d8:
      vVar13 = (__result._M_current)->diameter;
      uVar14 = *(undefined4 *)&(__result._M_current)->field_0x4;
      uVar6 = *(undefined8 *)&(__result._M_current)->field_0x8;
      sVar10 = (__result._M_current)->index;
      uVar7 = *(undefined8 *)((long)&(__result._M_current)->index + 8);
      vVar11 = (__a._M_current)->diameter;
      uVar12 = *(undefined4 *)&(__a._M_current)->field_0x4;
      uVar8 = *(undefined8 *)&(__a._M_current)->field_0x8;
      uVar9 = *(undefined8 *)((long)&(__a._M_current)->index + 8);
      *(long *)&(__result._M_current)->index = (long)(__a._M_current)->index;
      *(undefined8 *)((long)&(__result._M_current)->index + 8) = uVar9;
      (__result._M_current)->diameter = vVar11;
      *(undefined4 *)&(__result._M_current)->field_0x4 = uVar12;
      *(undefined8 *)&(__result._M_current)->field_0x8 = uVar8;
      *(long *)&(__a._M_current)->index = (long)sVar10;
      *(undefined8 *)((long)&(__a._M_current)->index + 8) = uVar7;
      (__a._M_current)->diameter = vVar13;
      *(undefined4 *)&(__a._M_current)->field_0x4 = uVar14;
      *(undefined8 *)&(__a._M_current)->field_0x8 = uVar6;
      return;
    }
    if ((fVar4 < fVar3) ||
       (((fVar3 == fVar4 && (!NAN(fVar3) && !NAN(fVar4))) &&
        (uVar5 = *(ulong *)((long)&(__b._M_current)->index + 8),
        puVar1 = (ulong *)((long)&(__c._M_current)->index + 8),
        uVar5 < *puVar1 ||
        uVar5 - *puVar1 < (ulong)((ulong)(__b._M_current)->index < (ulong)(__c._M_current)->index)))
       )) {
LAB_0011c3a7:
      vVar13 = (__result._M_current)->diameter;
      uVar14 = *(undefined4 *)&(__result._M_current)->field_0x4;
      uVar6 = *(undefined8 *)&(__result._M_current)->field_0x8;
      sVar10 = (__result._M_current)->index;
      uVar7 = *(undefined8 *)((long)&(__result._M_current)->index + 8);
      vVar11 = (__c._M_current)->diameter;
      uVar12 = *(undefined4 *)&(__c._M_current)->field_0x4;
      uVar8 = *(undefined8 *)&(__c._M_current)->field_0x8;
      uVar9 = *(undefined8 *)((long)&(__c._M_current)->index + 8);
      *(long *)&(__result._M_current)->index = (long)(__c._M_current)->index;
      *(undefined8 *)((long)&(__result._M_current)->index + 8) = uVar9;
      (__result._M_current)->diameter = vVar11;
      *(undefined4 *)&(__result._M_current)->field_0x4 = uVar12;
      *(undefined8 *)&(__result._M_current)->field_0x8 = uVar8;
      *(long *)&(__c._M_current)->index = (long)sVar10;
      *(undefined8 *)((long)&(__c._M_current)->index + 8) = uVar7;
      (__c._M_current)->diameter = vVar13;
      *(undefined4 *)&(__c._M_current)->field_0x4 = uVar14;
      *(undefined8 *)&(__c._M_current)->field_0x8 = uVar6;
      return;
    }
  }
  vVar13 = (__result._M_current)->diameter;
  uVar14 = *(undefined4 *)&(__result._M_current)->field_0x4;
  uVar6 = *(undefined8 *)&(__result._M_current)->field_0x8;
  sVar10 = (__result._M_current)->index;
  uVar7 = *(undefined8 *)((long)&(__result._M_current)->index + 8);
  vVar11 = (__b._M_current)->diameter;
  uVar12 = *(undefined4 *)&(__b._M_current)->field_0x4;
  uVar8 = *(undefined8 *)&(__b._M_current)->field_0x8;
  uVar9 = *(undefined8 *)((long)&(__b._M_current)->index + 8);
  *(long *)&(__result._M_current)->index = (long)(__b._M_current)->index;
  *(undefined8 *)((long)&(__result._M_current)->index + 8) = uVar9;
  (__result._M_current)->diameter = vVar11;
  *(undefined4 *)&(__result._M_current)->field_0x4 = uVar12;
  *(undefined8 *)&(__result._M_current)->field_0x8 = uVar8;
  *(long *)&(__b._M_current)->index = (long)sVar10;
  *(undefined8 *)((long)&(__b._M_current)->index + 8) = uVar7;
  (__b._M_current)->diameter = vVar13;
  *(undefined4 *)&(__b._M_current)->field_0x4 = uVar14;
  *(undefined8 *)&(__b._M_current)->field_0x8 = uVar6;
  return;
}

Assistant:

static simplex_t get_index(const diameter_simplex_t& i) { return i.index; }